

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::Lookup
          (PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *this,
          dtime_tz_t *value)

{
  primitive_dictionary_entry_t *ppVar1;
  ulong uVar2;
  primitive_dictionary_entry_t *ppVar3;
  
  uVar2 = duckdb::Hash<duckdb::dtime_tz_t>((dtime_tz_t)value->bits);
  ppVar1 = this->dictionary;
  uVar2 = uVar2 & this->capacity_mask;
  ppVar3 = ppVar1 + uVar2;
  if (ppVar1[uVar2].index != 0xffffffff) {
    do {
      if ((ppVar3->value).bits == value->bits) {
        return ppVar3;
      }
      uVar2 = uVar2 + 1 & this->capacity_mask;
      ppVar3 = ppVar1 + uVar2;
    } while (ppVar1[uVar2].index != 0xffffffff);
  }
  return ppVar3;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}